

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O1

void vmOadd(VM vm)

{
  Data data;
  Data data_00;
  Data data_01;
  Object o;
  String name;
  
  data = pop(vm->stack);
  data_00 = pop(vm->stack);
  data_01 = pop(vm->stack);
  o = valObject(data_01);
  name = valString(data_00);
  putObject(o,name,data);
  shallowFreeData(data_00);
  push(vm->stack,data_01);
  return;
}

Assistant:

void vmOadd(VM vm) {
    Data val = pop(vm->stack); /*control of val passed to arr*/
    Data str = pop(vm->stack); /*control of str passed to arr, but only its value*/
    Data obj = pop(vm->stack);
    putObject(valObject(obj), valString(str), val);
    shallowFreeData(str);
    push(vm->stack, obj);
}